

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
TTDHandleBreakpointInfoAndInflate
          (int64_t snapTime,JsrtRuntime *runtime,ThreadContext *threadContext)

{
  bool bVar1;
  AutoNestedHandledExceptionType local_38 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_38,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  bVar1 = TTD::EventLog::IsDebugModeFlagSet(threadContext->TTDLog);
  if (bVar1) {
    TTD::ExecutionInfoManager::LoadPreservedBPInfo(threadContext->TTDExecutionInfo,threadContext);
  }
  TTD::EventLog::DoSnapshotInflate(threadContext->TTDLog,snapTime);
  TTD::EventLog::ResetCallStackForTopLevelCall(threadContext->TTDLog,-1);
  if (threadContext->TTDExecutionInfo != (ExecutionInfoManager *)0x0) {
    TTD::ExecutionInfoManager::ResetCallStackForTopLevelCall(threadContext->TTDExecutionInfo,-1);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_38);
  return JsNoError;
}

Assistant:

JsErrorCode TTDHandleBreakpointInfoAndInflate(int64_t snapTime, JsrtRuntime* runtime, ThreadContext* threadContext)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
    {
        if(threadContext->TTDLog->IsDebugModeFlagSet())
        {
            threadContext->TTDExecutionInfo->LoadPreservedBPInfo(threadContext);
        }

        threadContext->TTDLog->DoSnapshotInflate(snapTime);

        threadContext->TTDLog->ResetCallStackForTopLevelCall(-1);
        if(threadContext->TTDExecutionInfo != nullptr)
        {
            threadContext->TTDExecutionInfo->ResetCallStackForTopLevelCall(-1);
        }

        return JsNoError;
    });
}